

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,float *p_scroll_v,
                       float size_avail_v,float size_contents_v,ImDrawCornerFlags rounding_corners)

{
  ImGuiWindow *pIVar1;
  undefined1 auVar2 [12];
  bool bVar3;
  undefined1 auVar4 [12];
  ImGuiContext *pIVar5;
  ImU32 col;
  ImU32 col_00;
  ImGuiCol idx;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  uint in_XMM0_Dd;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar15;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar16;
  float fVar17;
  bool held;
  bool hovered;
  float local_cc;
  ImRect local_c8;
  float local_b4;
  float local_b0;
  ImDrawCornerFlags local_ac;
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  ImVec2 *local_60;
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    fVar16 = (bb_frame->Max).x - (bb_frame->Min).x;
    fVar17 = (bb_frame->Max).y - (bb_frame->Min).y;
    held = false;
    if ((0.0 < fVar16) && (0.0 < fVar17)) {
      local_cc = 1.0;
      if (axis == ImGuiAxis_Y) {
        fVar8 = (GImGui->Style).FramePadding.y;
        fVar8 = fVar8 + fVar8;
        if (fVar17 < fVar8 + GImGui->FontSize) {
          fVar8 = (fVar17 - GImGui->FontSize) / fVar8;
          if (fVar8 < 0.0) {
            return false;
          }
          local_cc = 1.0;
          if (fVar8 <= 1.0) {
            local_cc = fVar8;
          }
          if (local_cc <= 0.0) {
            return false;
          }
        }
      }
      iVar11 = (int)((fVar16 + -2.0) * 0.5);
      iVar15 = (int)((fVar17 + -2.0) * 0.5);
      auVar9._0_4_ = -(uint)(iVar11 < 0);
      auVar9._4_4_ = -(uint)(iVar15 < 0);
      auVar9._8_8_ = 0;
      auVar12._0_4_ = -(uint)(3 < iVar11);
      auVar12._4_4_ = -(uint)(3 < iVar15);
      auVar12._8_8_ = 0;
      auVar10._0_8_ = CONCAT44((float)iVar15,(float)iVar11) ^ 0x8000000080000000;
      auVar10._8_4_ = 0x80000000;
      auVar10._12_4_ = 0x80000000;
      auVar10 = auVar9 & _DAT_002a4240 | ~auVar9 & (auVar12 & _DAT_002a4230 | ~auVar12 & auVar10);
      fStack_90 = auVar10._0_4_;
      fVar17 = auVar10._4_4_;
      auVar13._0_8_ = auVar10._0_8_;
      auVar13._8_4_ = fStack_90;
      auVar13._12_4_ = fVar17;
      local_c8.Min.x = (bb_frame->Min).x;
      local_c8.Min.y = (bb_frame->Min).y;
      local_c8.Max.x = (bb_frame->Max).x;
      local_c8.Max.y = (bb_frame->Max).y;
      local_98 = local_c8.Min.x - fStack_90;
      fVar16 = local_c8.Min.y - fVar17;
      fStack_90 = local_c8.Max.x + fStack_90;
      fStack_94 = local_c8.Max.y + fVar17;
      auVar2._4_8_ = auVar13._8_8_;
      auVar2._0_4_ = local_c8.Min.y + fVar17;
      auVar14._0_8_ = auVar2._0_8_ << 0x20;
      auVar14._8_4_ = fStack_90;
      auVar14._12_4_ = fStack_94;
      local_c8.Max = auVar14._8_8_;
      local_c8.Min.y = fVar16;
      local_c8.Min.x = local_98;
      local_a8._4_4_ = in_XMM1_Db;
      local_a8._0_4_ = size_contents_v;
      local_a8._8_4_ = in_XMM1_Dc;
      local_a8._12_4_ = in_XMM1_Dd;
      if (axis != ImGuiAxis_X) {
        fStack_90 = fStack_94;
        local_98 = fVar16;
      }
      local_98 = fStack_90 - local_98;
      local_60 = &bb_frame->Max;
      local_88 = ZEXT416((uint)(GImGui->Style).GrabMinSize);
      held = false;
      hovered = false;
      local_ac = rounding_corners;
      fStack_8c = fStack_94;
      local_78 = size_avail_v;
      uStack_74 = in_XMM0_Db;
      uStack_70 = in_XMM0_Dc;
      uStack_6c = in_XMM0_Dd;
      ButtonBehavior(&local_c8,id,&hovered,&held,0x40000);
      fVar16 = (float)(~-(uint)(local_78 <= (float)local_a8._0_4_) & (uint)local_78 |
                      -(uint)(local_78 <= (float)local_a8._0_4_) & local_a8._0_4_);
      if (fVar16 <= 1.0) {
        fVar16 = 1.0;
      }
      fVar17 = (local_78 / fVar16) * local_98;
      fVar16 = local_98;
      if (fVar17 <= local_98) {
        fVar16 = fVar17;
      }
      fVar17 = (float)(-(uint)(fVar17 < (float)local_88._0_4_) & local_88._0_4_ |
                      ~-(uint)(fVar17 < (float)local_88._0_4_) & (uint)fVar16);
      uStack_74 = uStack_74 & local_88._4_4_ | ~uStack_74 & (uint)fStack_94;
      uStack_70 = uStack_70 & local_88._8_4_ | ~uStack_70 & (uint)fStack_90;
      uStack_6c = uStack_6c & local_88._12_4_ | ~uStack_6c & (uint)fStack_8c;
      fVar16 = 1.0;
      if (1.0 <= (float)local_a8._0_4_ - local_78) {
        fVar16 = (float)local_a8._0_4_ - local_78;
      }
      fVar8 = *p_scroll_v / fVar16;
      auVar6 = ZEXT812(0x3f800000);
      if (fVar8 <= 1.0) {
        auVar6._4_8_ = 0;
        auVar6._0_4_ = fVar8;
      }
      auVar4._4_8_ = 0;
      auVar4._0_4_ = auVar6._8_4_;
      local_a8._0_4_ =
           ((float)(~-(uint)(fVar8 < 0.0) & auVar6._0_4_) * (local_98 - fVar17)) / local_98;
      local_a8._4_8_ = SUB128(auVar4 << 0x40,4);
      local_a8._12_4_ = 0;
      local_78 = fVar17;
      if (((1.0 <= local_cc) && (fVar17 / local_98 < 1.0)) && (held != false)) {
        local_b4 = local_98 - fVar17;
        local_b0 = fVar16;
        local_88._4_4_ = uStack_74;
        local_88._0_4_ = fVar17 / local_98;
        local_88._8_4_ = uStack_70;
        local_88._12_4_ = uStack_6c;
        fVar16 = (*(float *)((pIVar5->IO).MouseDown + (long)axis * 4 + -8) - (&local_c8.Min.x)[axis]
                 ) / local_98;
        auVar7 = ZEXT812(0x3f800000);
        if (fVar16 <= 1.0) {
          auVar7._4_8_ = 0;
          auVar7._0_4_ = fVar16;
        }
        local_58._0_4_ = ~-(uint)(fVar16 < 0.0) & auVar7._0_4_;
        local_58._4_4_ = 0;
        local_58._8_4_ = auVar7._8_4_;
        local_58._12_4_ = 0;
        SetHoveredID(id);
        if (pIVar5->ActiveIdIsJustActivated == false) {
          fVar16 = pIVar5->ScrollbarClickDeltaToGrabCenter;
          bVar3 = false;
        }
        else if (((float)local_58._0_4_ < (float)local_a8._0_4_) ||
                ((float)local_88._0_4_ + (float)local_a8._0_4_ < (float)local_58._0_4_)) {
          pIVar5->ScrollbarClickDeltaToGrabCenter = 0.0;
          bVar3 = true;
          fVar16 = 0.0;
        }
        else {
          fVar16 = (float)local_88._0_4_ * -0.5 + ((float)local_58._0_4_ - (float)local_a8._0_4_);
          pIVar5->ScrollbarClickDeltaToGrabCenter = fVar16;
          bVar3 = false;
        }
        fVar17 = (((float)local_58._0_4_ - fVar16) - (float)local_88._0_4_ * 0.5) /
                 (1.0 - (float)local_88._0_4_);
        fVar16 = 1.0;
        if (fVar17 <= 1.0) {
          fVar16 = fVar17;
        }
        fVar17 = (float)(int)((float)(~-(uint)(fVar17 < 0.0) & (uint)fVar16) * local_b0 + 0.5);
        *p_scroll_v = fVar17;
        fVar17 = fVar17 / local_b0;
        fVar16 = 1.0;
        if (fVar17 <= 1.0) {
          fVar16 = fVar17;
        }
        fVar16 = (local_b4 * (float)(~-(uint)(fVar17 < 0.0) & (uint)fVar16)) / local_98;
        local_a8 = ZEXT416((uint)fVar16);
        if (bVar3) {
          pIVar5->ScrollbarClickDeltaToGrabCenter =
               -(float)local_88._0_4_ * 0.5 + ((float)local_58._0_4_ - fVar16);
        }
      }
      col = GetColorU32(0xe,1.0);
      idx = 0x11;
      if (held == false) {
        idx = (hovered & 1) + 0xf;
      }
      col_00 = GetColorU32(idx,local_cc);
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&bb_frame->Min,local_60,col,pIVar1->WindowRounding,local_ac);
      if (axis == ImGuiAxis_X) {
        local_40.x = local_c8.Min.x + (local_c8.Max.x - local_c8.Min.x) * (float)local_a8._0_4_;
        local_38.x = local_78 + local_40.x;
        local_40.y = local_c8.Min.y;
        local_38.y = local_c8.Max.y;
      }
      else {
        local_40.y = (local_c8.Max.y - local_c8.Min.y) * (float)local_a8._0_4_ + local_c8.Min.y;
        local_38.x = local_c8.Max.x;
        local_38.y = local_78 + local_40.y;
        local_40.x = local_c8.Min.x;
      }
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&local_40,&local_38,col_00,(pIVar5->Style).ScrollbarRounding,0xf);
    }
  }
  else {
    held = false;
  }
  return held;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, float* p_scroll_v, float size_avail_v, float size_contents_v, ImDrawCornerFlags rounding_corners)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = bb.Min[axis];
        float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = IM_ROUND(scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));

        // Update values for rendering
        scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, rounding_corners);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}